

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::MockConnectionReceiver>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::MockConnectionReceiver> *this,void *pointer)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  
  if (pointer != (void *)0x0) {
    lVar1 = *(long *)((long)pointer + 0x20);
    if (lVar1 != 0) {
      lVar2 = *(long *)((long)pointer + 0x28);
      lVar3 = *(long *)((long)pointer + 0x30);
      *(undefined8 *)((long)pointer + 0x20) = 0;
      *(undefined8 *)((long)pointer + 0x28) = 0;
      *(undefined8 *)((long)pointer + 0x30) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x38))
                (*(undefined8 **)((long)pointer + 0x38),lVar1,0x1a8,
                 (lVar2 - lVar1 >> 3) * 0x21cfb2b78c13521d,(lVar3 - lVar1 >> 3) * 0x21cfb2b78c13521d
                 ,ArrayDisposer::
                  Dispose_<kj::(anonymous_namespace)::MockConnectionReceiver::ClientRequest>::
                  destruct);
    }
    plVar4 = *(long **)((long)pointer + 0x18);
    if (plVar4 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x18) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x10))
                (*(undefined8 **)((long)pointer + 0x10),(long)plVar4 + *(long *)(*plVar4 + -0x10));
    }
    AsyncObject::~AsyncObject((AsyncObject *)pointer);
    operator_delete(pointer,0x40);
    return;
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }